

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::PtrOffsetInst::display(PtrOffsetInst *this,ostream *o)

{
  ostream *poVar1;
  ostream *in_RSI;
  Displayable *in_RDI;
  
  poVar1 = prelude::operator<<(in_RSI,in_RDI);
  std::operator<<(poVar1," = offset ");
  poVar1 = prelude::operator<<(in_RSI,in_RDI);
  std::operator<<(poVar1," by ");
  prelude::operator<<(in_RSI,in_RDI);
  return;
}

Assistant:

void PtrOffsetInst::display(std::ostream& o) const {
  o << dest << " = offset " << ptr << " by " << offset;
}